

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O2

LY_ERR lys_compile_unres_depset(ly_ctx *ctx,lys_glob_unres *unres)

{
  lysc_type_bitenum_item *item;
  uint32_t uVar1;
  lyd_node *plVar2;
  lysc_node *plVar3;
  lyplg_type *plVar4;
  lys_module *plVar5;
  lys_module *plVar6;
  lyd_node_inner *plVar7;
  bool bVar8;
  undefined1 *puVar9;
  ly_ctx *ctx_00;
  bool bVar10;
  ly_bool lVar11;
  LY_ERR LVar12;
  int iVar13;
  LY_ERR LVar14;
  lysc_type_leafref *plVar15;
  lysc_must *plVar16;
  lysc_type *plVar17;
  lys_module *plVar18;
  lysc_when **pplVar19;
  lysc_when *plVar20;
  lysc_must *plVar21;
  lysc_ext_instance *plVar22;
  lysc_node *plVar23;
  long lVar24;
  long *plVar25;
  void *pvVar26;
  lyd_value *storage;
  ushort uVar27;
  ulong uVar28;
  char *format;
  ushort uVar29;
  lysc_ext_instance *plVar30;
  ulong uVar31;
  void *pvVar32;
  ushort uVar33;
  size_t __size;
  ushort uVar34;
  char *pcVar35;
  uint uVar36;
  ulong uVar37;
  lysc_node *plVar38;
  lysc_type **pplVar39;
  undefined4 *puVar40;
  long lVar41;
  ly_ht *plVar42;
  ulong uVar43;
  lyxp_set_scnode *plVar44;
  lysp_module **pplVar45;
  uint64_t u;
  lysc_when *local_1270;
  void *local_1268;
  lysc_node *local_1260;
  uint64_t v;
  ulong local_1240;
  lysc_node *local_1238;
  lysf_ctx *local_1230;
  uint local_1224;
  ly_set *local_1220;
  ly_set *local_1218;
  ly_set *local_1210;
  ly_set *local_1208;
  ly_set *local_1200;
  lyxp_set local_11f8;
  ly_path *path;
  anon_union_16_6_11486145_for_val local_1158;
  uint local_1148;
  lysc_ctx cctx;
  
  memset(&cctx,0,0x10a0);
  local_1218 = &(unres->ds_unres).whens;
  local_1220 = &(unres->ds_unres).musts;
  local_1200 = &(unres->ds_unres).disabled_leafrefs;
  local_1230 = &cctx.free_ctx;
  local_1208 = &(unres->ds_unres).disabled_bitenums;
  local_1210 = &(unres->ds_unres).dflts;
  local_1240 = 0;
  do {
    uVar31 = 0;
    uVar43 = 0;
    u = 0;
    uVar37 = 0;
    do {
      for (uVar31 = uVar31 & 0xffffffff; uVar31 < (unres->ds_unres).disabled_leafrefs.count;
          uVar31 = uVar31 + 1) {
        plVar2 = (unres->ds_unres).disabled_leafrefs.field_2.dnodes[uVar31];
        local_11f8._0_8_ = (lysc_ext_instance *)0x0;
        while (plVar15 = lys_type_leafref_next(*(lysc_node **)plVar2,(uint64_t *)&local_11f8),
              plVar15 != (lysc_type_leafref *)0x0) {
          LVar12 = lys_compile_expr_implement
                             (ctx,plVar15->path,LY_VALUE_SCHEMA_RESOLVED,plVar15->prefixes,'\x01',
                              unres,(lys_module **)0x0);
          if (LVar12 != LY_SUCCESS) goto LAB_0014127d;
        }
      }
      for (uVar43 = uVar43 & 0xffffffff; uVar43 < (unres->ds_unres).leafrefs.count;
          uVar43 = uVar43 + 1) {
        plVar2 = (unres->ds_unres).leafrefs.field_2.dnodes[uVar43];
        local_11f8._0_8_ = (lysc_ext_instance *)0x0;
        while (plVar15 = lys_type_leafref_next(*(lysc_node **)plVar2,(uint64_t *)&local_11f8),
              plVar15 != (lysc_type_leafref *)0x0) {
          LVar12 = lys_compile_expr_implement
                             (ctx,plVar15->path,LY_VALUE_SCHEMA_RESOLVED,plVar15->prefixes,'\x01',
                              unres,(lys_module **)0x0);
          if (LVar12 != LY_SUCCESS) goto LAB_0014127d;
        }
      }
      u = u & 0xffffffff;
      while (u < (unres->ds_unres).whens.count) {
        plVar3 = (unres->ds_unres).whens.field_2.dnodes[u]->schema;
        LVar12 = lys_compile_expr_implement
                           (ctx,*(lyxp_expr **)plVar3,LY_VALUE_SCHEMA_RESOLVED,plVar3->parent,
                            (byte)ctx->flags & 2,unres,(lys_module **)&path);
        if (LVar12 != LY_SUCCESS) goto LAB_0014127d;
        if (path == (ly_path *)0x0) {
          u = u + 1;
        }
        else {
          ly_log(ctx,LY_LLWRN,LY_SUCCESS,
                 "When condition \"%s\" check skipped because referenced module \"%s\" is not implemented."
                );
          ly_set_rm_index(local_1218,(uint32_t)u,free);
        }
      }
      uVar37 = uVar37 & 0xffffffff;
      plVar30 = (lysc_ext_instance *)local_11f8._0_8_;
      while (uVar37 < (unres->ds_unres).musts.count) {
        local_1238 = (lysc_node *)(unres->ds_unres).musts.field_2.dnodes[uVar37];
        plVar16 = lysc_node_musts(*(lysc_node **)local_1238);
        plVar30 = (lysc_ext_instance *)0x0;
        bVar8 = false;
        plVar21 = plVar16;
        while( true ) {
          if (plVar16 == (lysc_must *)0x0) {
            plVar22 = (lysc_ext_instance *)0x0;
          }
          else {
            plVar22 = plVar16[-1].exts;
          }
          if (plVar22 <= plVar30) break;
          LVar12 = lys_compile_expr_implement
                             (ctx,plVar21->cond,LY_VALUE_SCHEMA_RESOLVED,plVar21->prefixes,
                              (byte)ctx->flags & 2,unres,(lys_module **)&path);
          if (LVar12 != LY_SUCCESS) goto LAB_0014127d;
          if (path != (ly_path *)0x0) {
            ly_log(ctx,LY_LLWRN,LY_SUCCESS,
                   "Must condition \"%s\" check skipped because referenced module \"%s\" is not implemented."
                  );
            bVar8 = true;
          }
          plVar30 = (lysc_ext_instance *)((long)&plVar30->def + 1);
          plVar21 = plVar21 + 1;
        }
        if (bVar8) {
          lysc_unres_must_free((lysc_unres_must *)local_1238);
          ly_set_rm_index(local_1220,(uint32_t)uVar37,(_func_void_void_ptr *)0x0);
        }
        else {
          uVar37 = uVar37 + 1;
        }
      }
      uVar36 = (unres->ds_unres).disabled_leafrefs.count;
      local_11f8._0_8_ = plVar30;
    } while ((((uint)uVar31 < uVar36) || ((uint)uVar43 < (unres->ds_unres).leafrefs.count)) ||
            ((uint32_t)u < (unres->ds_unres).whens.count));
    while (uVar36 != 0) {
      plVar2 = (unres->ds_unres).disabled_leafrefs.field_2.dnodes[uVar36 - 1];
      cctx.pmod = *(lysp_module **)(*(long *)(*(long *)plVar2 + 8) + 0x50);
      cctx.cur_mod = (cctx.pmod)->mod;
      cctx.ctx = (cctx.cur_mod)->ctx;
      cctx.ext = (lysc_ext_instance *)plVar2->parent;
      cctx.path_len = 1;
      cctx.path[0] = '/';
      cctx.free_ctx.ctx = (*(lysc_node **)plVar2)->module->parsed->mod->ctx;
      LVar12 = LY_SUCCESS;
      ly_log_location(*(lysc_node **)plVar2,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      v = 0;
      while( true ) {
        if (LVar12 != LY_SUCCESS) goto LAB_001412bb;
        plVar15 = lys_type_leafref_next(*(lysc_node **)plVar2,&v);
        if (plVar15 == (lysc_type_leafref *)0x0) break;
        LVar12 = lys_compile_unres_leafref
                           (&cctx,*(lysc_node **)plVar2,plVar15,(lysp_module *)plVar2->schema);
      }
      ly_log_location_revert(1,0,0,0);
      ly_set_rm_index(local_1200,uVar36 - 1,free);
      uVar36 = (unres->ds_unres).disabled_leafrefs.count;
    }
    uVar31 = local_1240 & 0xffffffff;
    local_1240 = uVar31;
    for (; uVar37 = (ulong)(unres->ds_unres).leafrefs.count, uVar31 < uVar37; uVar31 = uVar31 + 1) {
      plVar2 = (unres->ds_unres).leafrefs.field_2.dnodes[uVar31];
      cctx.pmod = *(lysp_module **)(*(long *)(*(long *)plVar2 + 8) + 0x50);
      cctx.cur_mod = (cctx.pmod)->mod;
      cctx.ctx = (cctx.cur_mod)->ctx;
      cctx.ext = (lysc_ext_instance *)plVar2->parent;
      cctx.path_len = 1;
      cctx.path[0] = '/';
      cctx.free_ctx.ctx = (*(lysc_node **)plVar2)->module->parsed->mod->ctx;
      LVar12 = LY_SUCCESS;
      ly_log_location(*(lysc_node **)plVar2,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      v = 0;
      while( true ) {
        if (LVar12 != LY_SUCCESS) goto LAB_001412bb;
        plVar15 = lys_type_leafref_next(*(lysc_node **)plVar2,&v);
        if (plVar15 == (lysc_type_leafref *)0x0) break;
        LVar12 = lys_compile_unres_leafref
                           (&cctx,*(lysc_node **)plVar2,plVar15,(lysp_module *)plVar2->schema);
      }
      ly_log_location_revert(1,0,0,0);
    }
    for (; local_1240 < uVar37; local_1240 = local_1240 + 1) {
      plVar2 = (unres->ds_unres).leafrefs.field_2.dnodes[local_1240];
      v = 0;
      while (plVar15 = lys_type_leafref_next(*(lysc_node **)plVar2,&v),
            plVar15 != (lysc_type_leafref *)0x0) {
        pplVar39 = &plVar15->realtype;
        plVar17 = (lysc_type *)pplVar39;
        do {
          plVar4 = *(lyplg_type **)plVar17;
          plVar17 = (lysc_type *)&plVar4->duplicate;
        } while (*(LY_DATA_TYPE *)&plVar4->compare == LY_TYPE_LEAFREF);
        lysc_type_free(local_1230,*pplVar39);
        *pplVar39 = (lysc_type *)plVar4;
        puVar9 = (undefined1 *)((long)&plVar4->compare + 4);
        *(int *)puVar9 = *(int *)puVar9 + 1;
      }
      uVar37 = (ulong)(unres->ds_unres).leafrefs.count;
    }
    while (uVar1 = (unres->ds_unres).whens.count, uVar1 != 0) {
      uVar36 = uVar1 - 1;
      plVar2 = (unres->ds_unres).whens.field_2.dnodes[uVar36];
      cctx.pmod = *(lysp_module **)(*(long *)(*(long *)plVar2 + 8) + 0x50);
      cctx.cur_mod = (cctx.pmod)->mod;
      cctx.ctx = (cctx.cur_mod)->ctx;
      cctx.ext = (lysc_ext_instance *)0x0;
      cctx.path_len = 1;
      cctx.path[0] = '/';
      cctx.free_ctx.ctx = (*(lysc_node **)plVar2)->module->parsed->mod->ctx;
      ly_log_location(*(lysc_node **)plVar2,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      plVar6 = *(lys_module **)plVar2;
      plVar3 = plVar2->schema;
      memset(&local_11f8,0,0x90);
      LVar12 = lyxp_atomize(cctx.ctx,*(lyxp_expr **)plVar3,(lys_module *)plVar6->name,
                            LY_VALUE_SCHEMA_RESOLVED,plVar3->parent,(lysc_node *)plVar3->module,
                            (lysc_node *)plVar3->module,&local_11f8,
                            *(uint16_t *)((long)&plVar6->ctx + 2) >> 9 & 0x10 | 8);
      if (LVar12 == LY_SUCCESS) {
        cctx.path[0] = '\0';
        lysc_path((lysc_node *)plVar6,LYSC_PATH_LOG,cctx.path,0xfee);
        lVar24 = 0xc;
        for (uVar31 = 0; uVar37 = (ulong)local_11f8.used, uVar31 < uVar37; uVar31 = uVar31 + 1) {
          if ((*(int *)((long)local_11f8.val.nodes + lVar24 + -4) == 3) &&
             (*(int *)((long)&(local_11f8.val.nodes)->node + lVar24) != -1)) {
            plVar5 = *(lys_module **)((long)local_11f8.val.nodes + lVar24 + -0xc);
            uVar29 = *(ushort *)((long)&plVar3->dsc + 4);
            uVar33 = *(uint16_t *)((long)&plVar5->ctx + 2);
            uVar27 = uVar29 & 0x1c;
            if ((uVar29 & 0x1c) == 0) {
              uVar27 = 4;
            }
            uVar29 = uVar33 & 0x1c;
            if ((uVar33 & 0x1c) == 0) {
              uVar29 = 4;
            }
            if (((lys_module *)plVar6->name == (lys_module *)plVar5->name) && (uVar27 < uVar29)) {
              pcVar35 = "deprecated";
              if (uVar33 == 0x10) {
                pcVar35 = "obsolete";
              }
              ly_log(cctx.ctx,LY_LLWRN,LY_SUCCESS,
                     "When condition \"%s\" may be referencing %s node \"%s\".",
                     *(undefined8 *)(*(long *)plVar3 + 0x28),pcVar35,plVar5->filepath);
            }
            plVar18 = (lys_module *)lysc_data_node((lysc_node *)plVar5->revision);
            if (plVar18 == plVar6) {
              pcVar35 = "When condition is accessing its own conditional node children.";
            }
            else {
              if ((plVar5 != plVar6) ||
                 (*(int *)((long)&(local_11f8.val.nodes)->node + lVar24) != 1)) goto LAB_001403e4;
              pcVar35 = "When condition is accessing its own conditional node value.";
            }
            ly_vlog(cctx.ctx,(char *)0x0,LYVE_SEMANTICS,pcVar35);
            LVar12 = LY_EVALID;
            goto LAB_0014073b;
          }
LAB_001403e4:
          lVar24 = lVar24 + 0x18;
        }
        if (plVar3->module != plVar6) {
          if ((lys_module *)(local_11f8.val.nodes)->node != plVar3->module) {
            __assert_fail("tmp_set.val.scnodes[0].scnode == when->context",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                          ,0x2a4,
                          "LY_ERR lys_compile_unres_when(struct lysc_ctx *, const struct lysc_when *, const struct lysc_node *)"
                         );
          }
          if ((local_11f8.val.nodes)->pos == 0xffffffff) {
            (local_11f8.val.scnodes)->scnode = (lysc_node *)plVar6;
          }
          else {
            LVar12 = lyxp_set_scnode_insert_node
                               (&local_11f8,(lysc_node *)plVar6,~LYXP_NODE_NONE,LYXP_AXIS_CHILD,
                                (uint32_t *)0x0);
            if (LVar12 != LY_SUCCESS) goto LAB_0014073b;
            uVar37 = (ulong)local_11f8.used;
          }
        }
        memset(&path,0,0x90);
        for (lVar24 = 0; uVar37 * 0x18 - lVar24 != 0; lVar24 = lVar24 + 0x18) {
          if (*(int *)((long)&(local_11f8.val.nodes)->pos + lVar24) != -1) {
            *(undefined4 *)((long)&(local_11f8.val.nodes)->pos + lVar24) = 2;
          }
        }
        for (uVar31 = 0; uVar31 < uVar37; uVar31 = uVar31 + 1) {
          lVar24 = uVar31 * 0x18;
          if (*(int *)((long)local_11f8.val.nodes + lVar24 + 0xc) == 2) {
            puVar40 = (undefined4 *)((long)local_11f8.val.nodes + lVar24 + 0xc);
            plVar44 = local_11f8.val.scnodes + lVar24;
            if ((plVar44->type == LYXP_NODE_ELEM) &&
               (pplVar19 = lysc_node_when(plVar44->scnode), pplVar19 != (lysc_when **)0x0)) {
              local_1260 = plVar44->scnode;
              do {
                ly_log_location(local_1260,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
                pplVar19 = lysc_node_when(local_1260);
                local_1270 = (lysc_when *)0x0;
                while( true ) {
                  if (pplVar19 == (lysc_when **)0x0) {
                    plVar20 = (lysc_when *)0x0;
                  }
                  else {
                    plVar20 = pplVar19[-1];
                  }
                  if (plVar20 <= local_1270) break;
                  plVar20 = pplVar19[(long)local_1270];
                  LVar12 = lyxp_atomize(local_11f8.ctx,plVar20->cond,local_1260->module,
                                        LY_VALUE_SCHEMA_RESOLVED,plVar20->prefixes,plVar20->context,
                                        plVar20->context,(lyxp_set *)&path,8);
                  if (LVar12 != LY_SUCCESS) {
                    ly_vlog(local_11f8.ctx,(char *)0x0,LYVE_SEMANTICS,
                            "Invalid when condition \"%s\".",plVar20->cond->expr);
LAB_001406f8:
                    ly_log_location_revert(1,0,0,0);
                    goto LAB_00140706;
                  }
                  lVar41 = 0;
                  for (uVar37 = 0; uVar37 < local_1148; uVar37 = uVar37 + 1) {
                    if (*(int *)((long)&(local_1158.nodes)->type + lVar41) == 3) {
                      lVar11 = lyxp_set_scnode_contains
                                         (&local_11f8,
                                          *(lysc_node **)((long)&(local_1158.nodes)->node + lVar41),
                                          LYXP_NODE_ELEM,-1,&local_1224);
                      if ((lVar11 != '\0') &&
                         (*(int *)((long)local_11f8.val.nodes + (ulong)local_1224 * 0x18 + 0xc) ==
                          -1)) {
                        ly_vlog(local_11f8.ctx,(char *)0x0,LYVE_SEMANTICS,
                                "When condition cyclic dependency on the node \"%s\".",
                                *(undefined8 *)
                                 (*(long *)((long)&(local_1158.nodes)->node + lVar41) + 0x28));
                        LVar12 = LY_EVALID;
                        goto LAB_001406f8;
                      }
                      *(undefined4 *)((long)&(local_1158.nodes)->pos + lVar41) = 2;
                    }
                    else {
                      *(undefined4 *)((long)&(local_1158.nodes)->pos + lVar41) = 0;
                    }
                    lVar41 = lVar41 + 0x18;
                  }
                  if (plVar20->context != local_1260) {
                    if ((lysc_node *)(local_1158.nodes)->node != plVar20->context) {
                      __assert_fail("tmp_set.val.scnodes[0].scnode == when->context",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                                    ,0x236,
                                    "LY_ERR lys_compile_unres_when_cyclic(struct lyxp_set *, const struct lysc_node *)"
                                   );
                    }
                    if ((local_1158.nodes)->pos == 0xffffffff) {
                      (local_1158.scnodes)->scnode = local_1260;
                    }
                    else {
                      LVar12 = lyxp_set_scnode_insert_node
                                         ((lyxp_set *)&path,local_1260,~LYXP_NODE_NONE,
                                          LYXP_AXIS_CHILD,(uint32_t *)0x0);
                      if (LVar12 != LY_SUCCESS) goto LAB_001406f8;
                    }
                  }
                  lyxp_set_scnode_merge(&local_11f8,(lyxp_set *)&path);
                  local_1270 = (lysc_when *)((long)&local_1270->cond + 1);
                }
                ly_log_location_revert(1,0,0,0);
                local_1260 = local_1260->parent;
              } while ((local_1260 != (lysc_node *)0x0) && ((local_1260->nodetype & 0x82) != 0));
              puVar40 = (undefined4 *)((long)local_11f8.val.nodes + lVar24 + 0xc);
            }
            *puVar40 = 0;
            uVar37 = (ulong)local_11f8.used;
          }
        }
        LVar12 = LY_SUCCESS;
LAB_00140706:
        lyxp_set_free_content((lyxp_set *)&path);
      }
      else {
        ly_vlog(cctx.ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid when condition \"%s\".",
                *(undefined8 *)(*(long *)plVar3 + 0x28));
      }
LAB_0014073b:
      lyxp_set_free_content(&local_11f8);
      ly_log_location_revert(1,0,0,0);
      if (LVar12 != LY_SUCCESS) goto LAB_0014127d;
      free(plVar2);
      ly_set_rm_index(local_1218,uVar36,(_func_void_void_ptr *)0x0);
    }
    while (uVar1 = (unres->ds_unres).musts.count, uVar1 != 0) {
      uVar36 = uVar1 - 1;
      plVar2 = (unres->ds_unres).musts.field_2.dnodes[uVar36];
      cctx.pmod = *(lysp_module **)(*(long *)(*(long *)plVar2 + 8) + 0x50);
      cctx.cur_mod = (cctx.pmod)->mod;
      cctx.ctx = (cctx.cur_mod)->ctx;
      cctx.ext = (lysc_ext_instance *)plVar2->parent;
      cctx.path_len = 1;
      cctx.path[0] = '/';
      cctx.free_ctx.ctx = (*(lysc_node **)plVar2)->module->parsed->mod->ctx;
      ly_log_location(*(lysc_node **)plVar2,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      plVar3 = *(lysc_node **)plVar2;
      plVar38 = plVar2->schema;
      ly_log_location(plVar3,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      memset(&path,0,0x90);
      uVar29 = plVar3->flags;
      plVar21 = lysc_node_musts(plVar3);
      plVar30 = (lysc_ext_instance *)0x0;
      while( true ) {
        if (plVar21 == (lysc_must *)0x0) {
          plVar22 = (lysc_ext_instance *)0x0;
        }
        else {
          plVar22 = plVar21[-1].exts;
        }
        if (plVar22 <= plVar30) {
          LVar12 = LY_SUCCESS;
          goto LAB_00140a09;
        }
        LVar12 = lyxp_atomize(cctx.ctx,plVar21[(long)plVar30].cond,plVar3->module,
                              LY_VALUE_SCHEMA_RESOLVED,plVar21[(long)plVar30].prefixes,plVar3,plVar3
                              ,(lyxp_set *)&path,uVar29 >> 9 & 0x10 | 8);
        if (LVar12 != LY_SUCCESS) break;
        cctx.path[0] = '\0';
        lysc_path(plVar3,LYSC_PATH_LOG,cctx.path,0xfee);
        for (lVar24 = 0; (ulong)local_1148 * 0x18 - lVar24 != 0; lVar24 = lVar24 + 0x18) {
          if (*(int *)((long)&(local_1158.nodes)->type + lVar24) == 3) {
            plVar6 = (lys_module *)**(undefined8 **)(plVar38->hash + (long)plVar30 * 8 + -4);
            uVar33 = 4;
            if ((plVar6 == plVar3->module) &&
               (uVar33 = plVar3->flags & 0x1c, (plVar3->flags & 0x1c) == 0)) {
              uVar33 = 4;
            }
            lVar41 = *(long *)((long)&(local_1158.nodes)->node + lVar24);
            uVar27 = *(ushort *)(lVar41 + 2);
            uVar34 = uVar27 & 0x1c;
            if ((uVar27 & 0x1c) == 0) {
              uVar34 = 4;
            }
            if ((plVar6 == *(lys_module **)(lVar41 + 8)) && (uVar33 < uVar34)) {
              pcVar35 = "deprecated";
              if (uVar27 == 0x10) {
                pcVar35 = "obsolete";
              }
              ly_log(cctx.ctx,LY_LLWRN,LY_SUCCESS,
                     "Must condition \"%s\" may be referencing %s node \"%s\".",
                     (plVar21[(long)plVar30].cond)->expr,pcVar35,*(undefined8 *)(lVar41 + 0x28));
              break;
            }
          }
        }
        lyxp_set_free_content((lyxp_set *)&path);
        plVar30 = (lysc_ext_instance *)((long)&plVar30->def + 1);
      }
      ly_vlog(cctx.ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid must condition \"%s\".",
              (plVar21[(long)plVar30].cond)->expr);
LAB_00140a09:
      lyxp_set_free_content((lyxp_set *)&path);
      ly_log_location_revert(1,0,0,0);
      ly_log_location_revert(1,0,0,0);
      if (LVar12 != LY_SUCCESS) goto LAB_0014127d;
      lysc_unres_must_free((lysc_unres_must *)plVar2);
      ly_set_rm_index(local_1220,uVar36,(_func_void_void_ptr *)0x0);
    }
    while (uVar1 = (unres->ds_unres).disabled_bitenums.count, uVar1 != 0) {
      uVar36 = uVar1 - 1;
      plVar3 = (lysc_node *)(unres->ds_unres).disabled_bitenums.field_2.dnodes[uVar36];
      cctx.pmod = plVar3->module->parsed;
      cctx.cur_mod = (cctx.pmod)->mod;
      cctx.ctx = (cctx.cur_mod)->ctx;
      cctx.ext = (lysc_ext_instance *)0x0;
      cctx.path_len = 1;
      cctx.path[0] = '/';
      cctx.free_ctx.ctx = plVar3->module->parsed->mod->ctx;
      ly_log_location(plVar3,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      if (*(int *)&(plVar3[1].parent)->next == 0xf) {
        plVar38 = (plVar3[1].parent)->prev;
        if (plVar38 == (lysc_node *)0x0) {
          plVar38 = (lysc_node *)0x0;
          local_1260 = (lysc_node *)0x0;
        }
        else {
          local_1260 = (lysc_node *)plVar38[-1].priv;
        }
      }
      else {
        plVar38 = (lysc_node *)&plVar3[1].parent;
        local_1260 = (lysc_node *)0x1;
      }
      bVar8 = false;
      local_1238 = plVar3;
      for (local_1270 = (lysc_when *)0x0; (lysc_node *)local_1270 != local_1260;
          local_1270 = (lysc_when *)((long)local_1270 + 1)) {
        lVar24 = *(long *)(plVar38->hash + (long)local_1270 * 8 + -4);
        if ((*(int *)(lVar24 + 0x18) == 0xb) || (bVar10 = true, *(int *)(lVar24 + 0x18) == 7)) {
          lVar41 = *(long *)(lVar24 + 0x20);
          u = 0;
          do {
            item = (lysc_type_bitenum_item *)(u * 0x28 + lVar41);
            while( true ) {
              if (lVar41 == 0) {
                uVar31 = 0;
              }
              else {
                uVar31 = *(ulong *)(lVar41 + -8);
              }
              if (uVar31 <= u) {
                bVar10 = bVar8;
                if ((*(long *)(lVar24 + 0x20) != 0) &&
                   (*(long *)(*(long *)(lVar24 + 0x20) + -8) != 0)) {
                  bVar10 = true;
                }
                goto LAB_00140bf1;
              }
              if ((item->flags & 0x100) == 0) break;
              lysc_enum_item_free(local_1230,item);
              uVar31 = *(long *)(lVar41 + -8) - 1;
              if (u <= uVar31 && uVar31 - u != 0) {
                memmove(item,(void *)(u * 0x28 + lVar41 + 0x28),(uVar31 - u) * 0x28);
                uVar31 = *(long *)(lVar41 + -8) - 1;
              }
              *(ulong *)(lVar41 + -8) = uVar31;
            }
            u = u + 1;
          } while( true );
        }
LAB_00140bf1:
        bVar8 = bVar10;
      }
      LVar12 = LY_SUCCESS;
      if (!bVar8) {
        ly_vlog(cctx.ctx,(char *)0x0,LYVE_SEMANTICS,
                "Node \"%s\" without any (or all disabled) valid values.",local_1238->name);
        LVar12 = LY_EVALID;
      }
      ly_log_location_revert(1,0,0,0);
      if (!bVar8) goto LAB_0014127d;
      ly_set_rm_index(local_1208,uVar36,(_func_void_void_ptr *)0x0);
    }
    while (uVar1 = (unres->ds_unres).dflts.count, uVar1 != 0) {
      uVar36 = uVar1 - 1;
      plVar2 = (unres->ds_unres).dflts.field_2.dnodes[uVar36];
      cctx.ctx = *(ly_ctx **)**(undefined8 **)(*(long *)(*(long *)plVar2 + 8) + 0x50);
      cctx.cur_mod = (lys_module *)**(undefined8 **)(*(long *)(*(long *)plVar2 + 8) + 0x50);
      cctx.pmod = *(lysp_module **)(*(long *)(*(long *)plVar2 + 8) + 0x50);
      cctx.ext = (lysc_ext_instance *)0x0;
      cctx.path_len = 1;
      cctx.path[0] = '/';
      cctx.free_ctx.ctx = *(ly_ctx **)**(undefined8 **)(*(long *)(*(long *)plVar2 + 8) + 0x50);
      ly_log_location(*(lysc_node **)plVar2,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      plVar3 = *(lysc_node **)plVar2;
      plVar38 = plVar2->schema;
      if (plVar3->nodetype == 4) {
        if (plVar3[1].prev != (lysc_node *)0x0) {
          __assert_fail("!leaf->dflt",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                        ,0x3de,
                        "LY_ERR lys_compile_unres_leaf_dlft(struct lysc_ctx *, struct lysc_node_leaf *, struct lysp_qname *, struct lys_glob_unres *)"
                       );
        }
        LVar12 = LY_SUCCESS;
        if ((plVar3->flags & 0x120) == 0) {
          plVar23 = (lysc_node *)calloc(1,0x28);
          plVar3[1].prev = plVar23;
          if (plVar23 == (lysc_node *)0x0) goto LAB_00140f9f;
          LVar14 = lys_compile_unres_dflt
                             (&cctx,plVar3,(lysc_type *)plVar3[1].parent,*(char **)plVar38,
                              (lysp_module *)plVar38->module,(lyd_value *)plVar23,unres);
          if (LVar14 != LY_SUCCESS) {
            free(plVar3[1].prev);
            plVar3[1].prev = (lysc_node *)0x0;
            LVar12 = LVar14;
          }
        }
      }
      else {
        plVar7 = plVar2->parent;
        if (plVar38 == (lysc_node *)0x0 && plVar7 == (lyd_node_inner *)0x0) {
          __assert_fail("dflt || dflts",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                        ,0x404,
                        "LY_ERR lys_compile_unres_llist_dflts(struct lysc_ctx *, struct lysc_node_leaflist *, struct lysp_qname *, struct lysp_qname *, struct lys_glob_unres *)"
                       );
        }
        plVar23 = plVar3[1].prev;
        if (plVar23 == (lysc_node *)0x0) {
          __size = 0x10;
          if (plVar7 != (lyd_node_inner *)0x0) {
            __size = (long)plVar7[-1].children_ht * 8 + 8;
          }
          plVar25 = (long *)calloc(1,__size);
          if (plVar25 != (long *)0x0) {
            lVar24 = 0;
            local_1268 = (void *)0x0;
            goto LAB_00140e3e;
          }
        }
        else {
          lVar24 = 8;
          if (plVar7 != (lyd_node_inner *)0x0) {
            lVar24 = (long)plVar7[-1].children_ht << 3;
          }
          local_1268 = plVar23[-1].priv;
          plVar25 = (long *)realloc(&plVar23[-1].priv,lVar24 + (long)local_1268 * 0x10 + 8);
          if (plVar25 != (long *)0x0) {
            lVar24 = *plVar25;
LAB_00140e3e:
            plVar23 = (lysc_node *)(plVar25 + 1);
            plVar3[1].prev = plVar23;
            if (plVar7 == (lyd_node_inner *)0x0) {
              memset(plVar25 + lVar24 + 1,0,(long)local_1268 * 8 + 8);
              storage = (lyd_value *)calloc(1,0x28);
              *(lyd_value **)(plVar23->hash + (long)local_1268 * 8 + -4) = storage;
              LVar12 = lys_compile_unres_dflt
                                 (&cctx,plVar3,(lysc_type *)plVar3[1].parent,*(char **)plVar38,
                                  (lysp_module *)plVar38->module,storage,unres);
              plVar23 = plVar3[1].prev;
              if (LVar12 != LY_SUCCESS) {
                pvVar32 = *(void **)(plVar23->hash + (long)local_1268 * 8 + -4);
LAB_00140f7b:
                free(pvVar32);
                goto LAB_00140fa9;
              }
              plVar23[-1].priv = (void *)((long)plVar23[-1].priv + 1);
            }
            else {
              plVar42 = plVar7[-1].children_ht;
              memset(plVar25 + lVar24 + 1,0,((long)&plVar42->used + (long)local_1268) * 8);
              pplVar45 = (lysp_module **)&(plVar7->field_0).node.schema;
              pvVar32 = local_1268;
              for (u = 0; u < plVar42; u = u + 1) {
                pvVar26 = calloc(1,0x28);
                *(void **)(plVar23->hash + (long)pvVar32 * 8 + -4) = pvVar26;
                LVar12 = lys_compile_unres_dflt
                                   (&cctx,plVar3,(lysc_type *)plVar3[1].parent,
                                    ((lysp_qname *)(pplVar45 + -1))->str,*pplVar45,
                                    *(lyd_value **)((plVar3[1].prev)->hash + (long)pvVar32 * 8 + -4)
                                    ,unres);
                plVar23 = plVar3[1].prev;
                if (LVar12 != LY_SUCCESS) {
                  pvVar32 = *(void **)(plVar23->hash + (long)pvVar32 * 8 + -4);
                  goto LAB_00140f7b;
                }
                plVar23[-1].priv = (void *)((long)plVar23[-1].priv + 1);
                plVar42 = plVar7[-1].children_ht;
                pplVar45 = pplVar45 + 3;
                pvVar32 = (void *)((long)pvVar32 + 1);
              }
            }
            LVar12 = LY_SUCCESS;
            if ((plVar3->flags & 1) != 0) {
              while( true ) {
                if (plVar23 == (lysc_node *)0x0) {
                  pvVar32 = (void *)0x0;
                }
                else {
                  pvVar32 = plVar23[-1].priv;
                }
                LVar12 = LY_SUCCESS;
                if (pvVar32 <= local_1268) break;
                pvVar32 = (void *)0x0;
                while (local_1268 != pvVar32) {
                  lVar24 = *(long *)((plVar3[1].prev)->hash + (long)local_1268 * 8 + -4);
                  iVar13 = (**(code **)(*(long *)(*(long *)(lVar24 + 8) + 0x10) + 0x18))
                                     (cctx.ctx,lVar24,
                                      *(undefined8 *)
                                       ((plVar3[1].prev)->hash + (long)pvVar32 * 8 + -4));
                  ctx_00 = cctx.ctx;
                  pvVar32 = (void *)((long)pvVar32 + 1);
                  if (iVar13 == 0) {
                    lVar24 = *(long *)((plVar3[1].prev)->hash + (long)local_1268 * 8 + -4);
                    (**(code **)(*(long *)(*(long *)(lVar24 + 8) + 0x10) + 0x28))
                              (cctx.ctx,lVar24,0,0,0,0);
                    ly_vlog(ctx_00,(char *)0x0,LYVE_SEMANTICS,
                            "Configuration leaf-list has multiple defaults of the same value \"%s\"."
                           );
                    LVar12 = LY_EVALID;
                    goto LAB_00140fa9;
                  }
                }
                local_1268 = (void *)((long)local_1268 + 1);
                plVar23 = plVar3[1].prev;
              }
            }
            goto LAB_00140fa9;
          }
        }
LAB_00140f9f:
        LVar12 = LY_EMEM;
        ly_log(cctx.ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
      }
LAB_00140fa9:
      ly_log_location_revert(1,0,0,0);
      if (LVar12 != LY_SUCCESS) goto LAB_0014127d;
      lysc_unres_dflt_free(ctx,(lysc_unres_dflt *)plVar2);
      ly_set_rm_index(local_1210,uVar36,(_func_void_void_ptr *)0x0);
    }
  } while (((((unres->ds_unres).leafrefs.count != (uint32_t)local_1240) ||
            ((unres->ds_unres).disabled_leafrefs.count != 0)) ||
           ((unres->ds_unres).whens.count != 0)) || ((unres->ds_unres).musts.count != 0));
  for (uVar36 = 0; uVar36 < (unres->ds_unres).disabled.count; uVar36 = uVar36 + 1) {
    plVar3 = (lysc_node *)(unres->ds_unres).disabled.field_2.dnodes[uVar36];
    plVar38 = plVar3;
    if ((plVar3->flags & 0x100) != 0) {
      ly_log_location(plVar3,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      pcVar35 = plVar3->name;
      ctx = plVar3->module->ctx;
      format = "Key \"%s\" is disabled.";
LAB_001414b4:
      ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,format,pcVar35);
      ly_log_location_revert(1,0,0,0);
      LVar12 = LY_EVALID;
      goto LAB_0014127d;
    }
LAB_00141106:
    plVar38 = plVar38->parent;
    if (plVar38 != (lysc_node *)0x0) {
      if (plVar38->nodetype == 0x10) {
        pcVar35 = plVar38[1].name;
        uVar31 = 0;
        while( true ) {
          if (pcVar35 == (char *)0x0) {
            uVar37 = 0;
          }
          else {
            uVar37 = *(ulong *)(pcVar35 + -8);
          }
          if (uVar37 <= uVar31) break;
          lVar24 = *(long *)(pcVar35 + uVar31 * 8);
          uVar37 = 0;
          while( true ) {
            if (lVar24 == 0) {
              uVar43 = 0;
            }
            else {
              uVar43 = *(ulong *)(lVar24 + -8);
            }
            if (uVar43 <= uVar37) break;
            if (*(lysc_node **)(lVar24 + uVar37 * 8) == plVar3) {
              uVar43 = *(ulong *)(lVar24 + -8);
              if (1 < uVar43) {
                uVar28 = uVar43 - 1;
                if (uVar37 < uVar28) {
                  memmove((void *)(lVar24 + uVar37 * 8),(void *)(lVar24 + uVar37 * 8 + 8),
                          (uVar43 - uVar37) * 8 - 8);
                  lVar24 = *(long *)(plVar38[1].name + uVar31 * 8);
                  uVar28 = *(long *)(lVar24 + -8) - 1;
                }
                *(ulong *)(lVar24 + -8) = uVar28;
                goto LAB_00141106;
              }
              free((ulong *)(lVar24 + -8));
              pcVar35 = plVar38[1].name;
              if (pcVar35 != (char *)0x0) {
                uVar37 = *(ulong *)(pcVar35 + -8);
                if (1 < uVar37) {
                  uVar43 = uVar37 - 1;
                  if (uVar31 < uVar43) {
                    memmove(pcVar35 + uVar31 * 8,pcVar35 + uVar31 * 8 + 8,(uVar37 + ~uVar31) * 8);
                    pcVar35 = plVar38[1].name;
                    uVar43 = *(long *)(pcVar35 + -8) - 1;
                  }
                  *(ulong *)(pcVar35 + -8) = uVar43;
                  goto LAB_00141106;
                }
                free(pcVar35 + -8);
              }
              plVar38[1].name = (char *)0x0;
              goto LAB_00141106;
            }
            uVar37 = uVar37 + 1;
          }
          uVar31 = uVar31 + 1;
        }
      }
      goto LAB_00141106;
    }
    cctx.pmod = plVar3->module->parsed;
    cctx.cur_mod = (cctx.pmod)->mod;
    cctx.ctx = (cctx.cur_mod)->ctx;
    cctx.ext = (lysc_ext_instance *)0x0;
    cctx.path_len = 1;
    cctx.path[0] = '/';
    cctx.free_ctx.ctx = plVar3->module->parsed->mod->ctx;
    lysc_node_free(local_1230,plVar3,'\x01');
  }
  LVar12 = LY_SUCCESS;
  for (u = 0; u < (unres->ds_unres).leafrefs.count; u = u + 1) {
    plVar2 = (unres->ds_unres).leafrefs.field_2.dnodes[u];
    cctx.pmod = *(lysp_module **)(*(long *)(*(long *)plVar2 + 8) + 0x50);
    cctx.cur_mod = (cctx.pmod)->mod;
    cctx.ctx = (cctx.cur_mod)->ctx;
    cctx.ext = (lysc_ext_instance *)plVar2->parent;
    cctx.path_len = 1;
    cctx.path[0] = '/';
    cctx.free_ctx.ctx = *(ly_ctx **)**(undefined8 **)(*(long *)(*(long *)plVar2 + 8) + 0x50);
    v = 0;
    while (plVar15 = lys_type_leafref_next(*(lysc_node **)plVar2,&v),
          plVar15 != (lysc_type_leafref *)0x0) {
      LVar14 = ly_path_compile_leafref
                         (cctx.ctx,*(lysc_node **)plVar2,cctx.ext,plVar15->path,
                          (((*(lysc_node **)plVar2)->flags >> 0xd & 1) != 0) + 1,0x20,
                          LY_VALUE_SCHEMA_RESOLVED,plVar15->prefixes,&path);
      ly_path_free(path);
      if (LVar14 != LY_SUCCESS) {
        if (LVar14 == LY_ERECOMPILE) {
          __assert_fail("ret != LY_ERECOMPILE",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                        ,0x5b9,
                        "LY_ERR lys_compile_unres_depset(struct ly_ctx *, struct lys_glob_unres *)")
          ;
        }
        ly_log_location(*(lysc_node **)plVar2,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
        pcVar35 = *(char **)(*(long *)plVar2 + 0x28);
        format = "Target of leafref \"%s\" cannot be referenced because it is disabled.";
        goto LAB_001414b4;
      }
    }
  }
LAB_0014127d:
  if (cctx.free_ctx.ext_set.count != 0) {
    __assert_fail("!cctx.free_ctx.ext_set.count",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x5c6,"LY_ERR lys_compile_unres_depset(struct ly_ctx *, struct lys_glob_unres *)"
                 );
  }
  return LVar12;
LAB_001412bb:
  ly_log_location_revert(1,0,0,0);
  goto LAB_0014127d;
}

Assistant:

static LY_ERR
lys_compile_unres_depset(struct ly_ctx *ctx, struct lys_glob_unres *unres)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_node *node;
    struct lysc_type *typeiter;
    struct lysc_type_leafref *lref;
    struct lysc_ctx cctx = {0};
    struct lys_depset_unres *ds_unres = &unres->ds_unres;
    struct ly_path *path;
    LY_ARRAY_COUNT_TYPE v;
    struct lysc_unres_leafref *l;
    struct lysc_unres_when *w;
    struct lysc_unres_must *m;
    struct lysc_unres_dflt *d;
    uint32_t i, processed_leafrefs = 0;

resolve_all:
    /* implement all referenced modules to get final ds_unres set */
    if ((ret = lys_compile_unres_depset_implement(ctx, unres))) {
        goto cleanup;
    }

    /* check disabled leafrefs */
    while (ds_unres->disabled_leafrefs.count) {
        /* remember index, it can change before we get to free this item */
        i = ds_unres->disabled_leafrefs.count - 1;
        l = ds_unres->disabled_leafrefs.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, l->node->module->parsed, l->ext);

        LOG_LOCSET(l->node, NULL);
        v = 0;
        while ((ret == LY_SUCCESS) && (lref = lys_type_leafref_next(l->node, &v))) {
            ret = lys_compile_unres_leafref(&cctx, l->node, lref, l->local_mod);
        }
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        ly_set_rm_index(&ds_unres->disabled_leafrefs, i, free);
    }

    /* for leafref, we need 2 rounds - first detects circular chain by storing the first referred type (which
     * can be also leafref, in case it is already resolved, go through the chain and check that it does not
     * point to the starting leafref type). The second round stores the first non-leafref type for later data validation.
     * Also do the same check for set of the disabled leafrefs, but without the second round. */
    for (i = processed_leafrefs; i < ds_unres->leafrefs.count; ++i) {
        l = ds_unres->leafrefs.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, l->node->module->parsed, l->ext);

        LOG_LOCSET(l->node, NULL);
        v = 0;
        while ((ret == LY_SUCCESS) && (lref = lys_type_leafref_next(l->node, &v))) {
            ret = lys_compile_unres_leafref(&cctx, l->node, lref, l->local_mod);
        }
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);
    }
    for (i = processed_leafrefs; i < ds_unres->leafrefs.count; ++i) {
        l = ds_unres->leafrefs.objs[i];

        /* store pointer to the real type */
        v = 0;
        while ((lref = lys_type_leafref_next(l->node, &v))) {
            for (typeiter = lref->realtype;
                    typeiter->basetype == LY_TYPE_LEAFREF;
                    typeiter = ((struct lysc_type_leafref *)typeiter)->realtype) {}

            lysc_type_free(&cctx.free_ctx, lref->realtype);
            lref->realtype = typeiter;
            ++lref->realtype->refcount;
        }

        /* if 'goto' will be used on the 'resolve_all' label, then the current leafref will not be processed again */
        processed_leafrefs++;
    }

    /* check when, the referenced modules must be implemented now */
    while (ds_unres->whens.count) {
        i = ds_unres->whens.count - 1;
        w = ds_unres->whens.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, w->node->module->parsed, NULL);

        LOG_LOCSET(w->node, NULL);
        ret = lys_compile_unres_when(&cctx, w->when, w->node);
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        free(w);
        ly_set_rm_index(&ds_unres->whens, i, NULL);
    }

    /* check must */
    while (ds_unres->musts.count) {
        i = ds_unres->musts.count - 1;
        m = ds_unres->musts.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, m->node->module->parsed, m->ext);

        LOG_LOCSET(m->node, NULL);
        ret = lys_compile_unres_must(&cctx, m->node, m->local_mods);
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        lysc_unres_must_free(m);
        ly_set_rm_index(&ds_unres->musts, i, NULL);
    }

    /* remove disabled enums/bits */
    while (ds_unres->disabled_bitenums.count) {
        i = ds_unres->disabled_bitenums.count - 1;
        node = ds_unres->disabled_bitenums.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, node->module->parsed, NULL);

        LOG_LOCSET(node, NULL);
        ret = lys_compile_unres_disabled_bitenum(&cctx, (struct lysc_node_leaf *)node);
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        ly_set_rm_index(&ds_unres->disabled_bitenums, i, NULL);
    }

    /* finish incomplete default values compilation */
    while (ds_unres->dflts.count) {
        i = ds_unres->dflts.count - 1;
        d = ds_unres->dflts.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, d->leaf->module->parsed, NULL);

        LOG_LOCSET(&d->leaf->node, NULL);
        if (d->leaf->nodetype == LYS_LEAF) {
            ret = lys_compile_unres_leaf_dlft(&cctx, d->leaf, d->dflt, unres);
        } else {
            ret = lys_compile_unres_llist_dflts(&cctx, d->llist, d->dflt, d->dflts, unres);
        }
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        lysc_unres_dflt_free(ctx, d);
        ly_set_rm_index(&ds_unres->dflts, i, NULL);
    }

    /* some unres items may have been added by the default values */
    if ((processed_leafrefs != ds_unres->leafrefs.count) || ds_unres->disabled_leafrefs.count ||
            ds_unres->whens.count || ds_unres->musts.count || ds_unres->dflts.count) {
        goto resolve_all;
    }

    /* finally, remove all disabled nodes */
    for (i = 0; i < ds_unres->disabled.count; ++i) {
        node = ds_unres->disabled.snodes[i];
        ret = lys_compile_unres_check_disabled(node);
        LY_CHECK_GOTO(ret, cleanup);

        LYSC_CTX_INIT_PMOD(cctx, node->module->parsed, NULL);

        lysc_node_free(&cctx.free_ctx, node, 1);
    }

    /* also check if the leafref target has not been disabled */
    for (i = 0; i < ds_unres->leafrefs.count; ++i) {
        l = ds_unres->leafrefs.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, l->node->module->parsed, l->ext);

        v = 0;
        while ((lref = lys_type_leafref_next(l->node, &v))) {
            ret = ly_path_compile_leafref(cctx.ctx, l->node, cctx.ext, lref->path,
                    (l->node->flags & LYS_IS_OUTPUT) ? LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT, LY_PATH_TARGET_MANY,
                    LY_VALUE_SCHEMA_RESOLVED, lref->prefixes, &path);
            ly_path_free(path);

            assert(ret != LY_ERECOMPILE);
            if (ret) {
                LOG_LOCSET(l->node, NULL);
                LOGVAL(ctx, LYVE_REFERENCE, "Target of leafref \"%s\" cannot be referenced because it is disabled.",
                        l->node->name);
                LOG_LOCBACK(1, 0);
                ret = LY_EVALID;
                goto cleanup;
            }
        }
    }

cleanup:
    assert(!cctx.free_ctx.ext_set.count);
    return ret;
}